

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<int,_QList<int>_>_>::copyAppend
          (QGenericArrayOps<std::pair<int,_QList<int>_>_> *this,pair<int,_QList<int>_> *b,
          pair<int,_QList<int>_> *e)

{
  qsizetype *pqVar1;
  pair<int,_QList<int>_> *ppVar2;
  long lVar3;
  Data *pDVar4;
  
  if ((b != e) && (b < e)) {
    ppVar2 = (this->super_QArrayDataPointer<std::pair<int,_QList<int>_>_>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<std::pair<int,_QList<int>_>_>).size;
      ppVar2[lVar3].first = b->first;
      pDVar4 = (b->second).d.d;
      ppVar2[lVar3].second.d.d = pDVar4;
      ppVar2[lVar3].second.d.ptr = (b->second).d.ptr;
      ppVar2[lVar3].second.d.size = (b->second).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<std::pair<int,_QList<int>_>_>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }